

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxCoroutine.cpp
# Opt level: O0

void __thiscall
Jinx::Impl::Coroutine::Coroutine
          (Coroutine *this,shared_ptr<Jinx::Impl::Script> *script,RuntimeID functionID,
          Parameters *params)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  __shared_ptr *this_00;
  BufferPtr *pBVar5;
  Variant local_e8;
  Variant *local_c0;
  Variant *param;
  const_iterator __end2;
  const_iterator __begin2;
  Parameters *__range2;
  Any local_90;
  undefined1 local_80 [40];
  undefined1 local_58 [8];
  FunctionDefinitionPtr functionDef;
  shared_ptr<Jinx::Impl::Runtime> runtime;
  Parameters *params_local;
  RuntimeID functionID_local;
  shared_ptr<Jinx::Impl::Script> *script_local;
  Coroutine *this_local;
  
  ICoroutine::ICoroutine(&this->super_ICoroutine);
  (this->super_ICoroutine)._vptr_ICoroutine = (_func_int **)&PTR_IsFinished_003beb38;
  std::shared_ptr<Jinx::Impl::Script>::shared_ptr(&this->m_script);
  Jinx::Variant::Variant(&this->m_returnValue);
  std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             script);
  Script::GetRuntime((Script *)
                     &functionDef.
                      super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  peVar2 = std::__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&functionDef.
                          super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  Runtime::FindFunction((Runtime *)local_58,(RuntimeID)peVar2);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_58);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_58);
    this_00 = (__shared_ptr *)FunctionDefinition::GetBytecode(peVar4);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&functionDef.
                              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      peVar4 = std::
               __shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_58);
      pBVar5 = FunctionDefinition::GetBytecode(peVar4);
      std::shared_ptr<Jinx::Buffer>::shared_ptr((shared_ptr<Jinx::Buffer> *)&local_90,pBVar5);
      std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)script);
      Script::GetUserContext((Script *)&__range2);
      Runtime::CreateScript((Runtime *)local_80,(BufferPtr *)peVar2,&local_90);
      std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>
                ((shared_ptr<Jinx::IScript> *)(local_80 + 0x10));
      std::shared_ptr<Jinx::Impl::Script>::operator=
                (&this->m_script,(shared_ptr<Jinx::Impl::Script> *)(local_80 + 0x10));
      std::shared_ptr<Jinx::Impl::Script>::~shared_ptr
                ((shared_ptr<Jinx::Impl::Script> *)(local_80 + 0x10));
      std::shared_ptr<Jinx::IScript>::~shared_ptr((shared_ptr<Jinx::IScript> *)local_80);
      std::any::~any((any *)&__range2);
      std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)&local_90);
      __end2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::begin(params);
      param = (Variant *)std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::end(params);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_Jinx::Variant_*,_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_>
                                         *)&param), bVar1) {
        local_c0 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Variant_*,_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_>
                   ::operator*(&__end2);
        peVar3 = std::
                 __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_script);
        Script::Push(peVar3,local_c0);
        __gnu_cxx::
        __normal_iterator<const_Jinx::Variant_*,_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_>
        ::operator++(&__end2);
      }
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_script);
      Script::CallBytecodeFunction(peVar3,(FunctionDefinitionPtr *)local_58,Finish);
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_script);
      Script::Execute(peVar3);
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_script);
      bVar1 = Script::IsFinished(peVar3);
      if (bVar1) {
        peVar3 = std::
                 __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_script);
        Script::Pop(&local_e8,peVar3);
        Jinx::Variant::operator=(&this->m_returnValue,&local_e8);
        Jinx::Variant::~Variant(&local_e8);
      }
      local_80[0x24] = '\0';
      local_80[0x25] = '\0';
      local_80[0x26] = '\0';
      local_80[0x27] = '\0';
    }
    else {
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)script);
      Script::Error(peVar3,"Native function can\'t be called as asynchronously as a coroutine");
      local_80[0x24] = '\x01';
      local_80[0x25] = '\0';
      local_80[0x26] = '\0';
      local_80[0x27] = '\0';
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)script);
    Script::Error(peVar3,"Could not find function definition for coroutine");
    local_80[0x24] = '\x01';
    local_80[0x25] = '\0';
    local_80[0x26] = '\0';
    local_80[0x27] = '\0';
  }
  std::shared_ptr<Jinx::Impl::FunctionDefinition>::~shared_ptr
            ((shared_ptr<Jinx::Impl::FunctionDefinition> *)local_58);
  std::shared_ptr<Jinx::Impl::Runtime>::~shared_ptr
            ((shared_ptr<Jinx::Impl::Runtime> *)
             &functionDef.
              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

inline_t Coroutine::Coroutine(const std::shared_ptr<Script> & script, RuntimeID functionID, const Parameters & params)
	{
		auto runtime = script->GetRuntime();
		FunctionDefinitionPtr functionDef = runtime->FindFunction(functionID);
		if (!functionDef)
		{
			script->Error("Could not find function definition for coroutine");
			return;
		}
		if (!functionDef->GetBytecode())
		{
			script->Error("Native function can't be called as asynchronously as a coroutine");
			return;
		}

		// Create a script to act as a coroutine.
		m_script = std::static_pointer_cast<Script>(runtime->CreateScript(functionDef->GetBytecode(), script->GetUserContext()));

		// Push all parameters in script stack
		for (const auto & param : params)
			m_script->Push(param);

		// Call the bytecode function, indicating the script should finish execution on return
		m_script->CallBytecodeFunction(functionDef, Script::OnReturn::Finish);

		// Initial script execution
		m_script->Execute();
		if (m_script->IsFinished())
			m_returnValue = m_script->Pop();
	}